

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  program_t *value;
  value_t *val;
  runtime_error *this;
  source_t source;
  vm_t vm;
  ifstream input;
  source_t local_298;
  stack_t local_280;
  long local_218 [4];
  int aiStack_1f8 [122];
  
  if (argc == 1) {
    noargs();
  }
  else {
    std::ifstream::ifstream(local_218);
    std::ifstream::open((char *)local_218,(_Ios_Openmode)argv[1]);
    if (*(int *)((long)aiStack_1f8 + *(long *)(local_218[0] + -0x18)) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Can\'t open file");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    deci::AssembleProgram(&local_298,(istream *)local_218);
    std::ifstream::close();
    deci::vm_t::vm_t((vm_t *)&local_280);
    value = deci::program_t::Create
                      (local_298.
                       super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>._M_impl
                       .super__Vector_impl_data._M_start,10);
    val = deci::vm_t::Run((vm_t *)&local_280,(value_t *)value);
    deci::stack_t::Push(&local_280,val);
    deci::stack_t::Print(&local_280,(ostream *)&std::cout);
    (*val->_vptr_value_t[3])(val);
    (*(value->super_function_t).super_value_t._vptr_value_t[3])(value);
    deci::vm_t::~vm_t((vm_t *)&local_280);
    if (local_298.super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>._M_impl.
        super__Vector_impl_data._M_start != (command_t *)0x0) {
      operator_delete(local_298.
                      super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::ifstream::~ifstream(local_218);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  if (argc == 1) {
    return noargs();
  }

  std::ifstream input;
  input.open(argv[1], std::ios::in);
  if (!input.good()) {
    throw std::runtime_error("Can't open file");
  }

  deci::program_t::source_t source = deci::AssembleProgram(input);
  input.close();

  deci::value_t* tmp;
  deci::vm_t vm;
  deci::program_t* prog = deci::program_t::Create(source.data(), deci::countof(commands));

  vm.GlobalStack().Push(*(tmp = vm.Run(*prog)));
  vm.GlobalStack().Print(std::cout);

  tmp->Delete();
  prog->Delete();

  return 0;
}